

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::ForceIDEval(Expr *this,Output *out_cc,Env *env)

{
  bool bVar1;
  iterator env_00;
  reference ppCVar2;
  Output *in_RDX;
  Expr *in_RSI;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *in_RDI;
  int i_2;
  iterator i_1;
  iterator i;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  Env *in_stack_ffffffffffffffc8;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
  in_stack_ffffffffffffffd0;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
  in_stack_ffffffffffffffe0;
  
  switch(*(undefined4 *)&in_RDI[0xb]._M_current) {
  case 0:
    bVar1 = Env::Evaluated(in_stack_ffffffffffffffc8,
                           (ID *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (!bVar1) {
      Env::Evaluate((Env *)in_stack_ffffffffffffffd0._M_current,(Output *)in_stack_ffffffffffffffc8,
                    (ID *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    break;
  case 1:
  case 9:
  case 10:
    break;
  default:
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      if (in_RDI[(long)iVar3 + 0xc]._M_current != (Expr **)0x0) {
        ForceIDEval(in_RSI,in_RDX,(Env *)in_stack_ffffffffffffffe0._M_current);
      }
    }
    break;
  case 5:
    ForceIDEval(in_RSI,in_RDX,(Env *)in_stack_ffffffffffffffe0._M_current);
    break;
  case 8:
    if (in_RDI[0x13]._M_current != (Expr **)0x0) {
      env_00 = std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                         ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffffa8);
      while( true ) {
        std::vector<Expr_*,_std::allocator<Expr_*>_>::end
                  ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffffa8);
        bVar1 = __gnu_cxx::operator!=
                          (in_RDI,(__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                                   *)in_stack_ffffffffffffffa8);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
        operator*((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                  &stack0xffffffffffffffe0);
        ForceIDEval(in_RSI,in_RDX,(Env *)env_00._M_current);
        __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
        operator++((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                   &stack0xffffffffffffffe0);
      }
    }
    break;
  case 0x21:
    ForceIDEval(in_RSI,in_RDX,(Env *)in_stack_ffffffffffffffe0._M_current);
    if (in_RDI[0x14]._M_current != (Expr **)0x0) {
      std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin(in_stack_ffffffffffffffa8);
      while( true ) {
        std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end(in_stack_ffffffffffffffa8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                            *)in_RDI,
                           (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                            *)in_stack_ffffffffffffffa8);
        if (!bVar1) break;
        ppCVar2 = __gnu_cxx::
                  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                  ::operator*((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                               *)&stack0xffffffffffffffd0);
        CaseExpr::value(*ppCVar2);
        ForceIDEval(in_RSI,in_RDX,(Env *)in_stack_ffffffffffffffe0._M_current);
        __gnu_cxx::
        __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
        operator++((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                    *)&stack0xffffffffffffffd0);
      }
    }
  }
  return;
}

Assistant:

void Expr::ForceIDEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			break;

		case EXPR_MEMBER:
			operand_[0]->ForceIDEval(out_cc, env);
			break;

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				(*i)->ForceIDEval(out_cc, env);
			}
			break;

		case EXPR_CASE:
			{
			operand_[0]->ForceIDEval(out_cc, env);
			foreach (i, CaseExprList, cases_)
				(*i)->value()->ForceIDEval(out_cc, env);
			}
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->ForceIDEval(out_cc, env);
			break;
		}
	}